

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts5StorageInsertCallback
              (void *pContext,int tflags,char *pToken,int nToken,int iUnused1,int iUnused2)

{
  int iCol;
  long *plVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int nToken_00;
  
  plVar1 = *(long **)(*pContext + 8);
  iVar3 = *(int *)((long)pContext + 0xc);
  if ((tflags & 1U) == 0) {
    iVar3 = iVar3 + 1;
  }
  else {
    if (iVar3 != 0) goto LAB_001bd08e;
    iVar3 = 1;
  }
  *(int *)((long)pContext + 0xc) = iVar3;
LAB_001bd08e:
  nToken_00 = 0x8000;
  if (nToken < 0x8000) {
    nToken_00 = nToken;
  }
  iCol = *(int *)((long)pContext + 8);
  lVar2 = *plVar1;
  iVar4 = sqlite3Fts5HashWrite((Fts5Hash *)plVar1[3],plVar1[5],iCol,iVar3 + -1,'0',pToken,nToken_00)
  ;
  for (lVar5 = 0; (iVar4 == 0 && (lVar5 < *(int *)(lVar2 + 0x30))); lVar5 = lVar5 + 1) {
    iVar4 = sqlite3Fts5IndexCharlenToBytelen
                      (pToken,nToken_00,*(int *)(*(long *)(lVar2 + 0x38) + lVar5 * 4));
    if (iVar4 == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = sqlite3Fts5HashWrite
                        ((Fts5Hash *)plVar1[3],plVar1[5],iCol,iVar3 + -1,(char)lVar5 + '1',pToken,
                         iVar4);
    }
  }
  return iVar4;
}

Assistant:

static int fts5StorageInsertCallback(
  void *pContext,                 /* Pointer to Fts5InsertCtx object */
  int tflags,
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iUnused1,                   /* Start offset of token */
  int iUnused2                    /* End offset of token */
){
  Fts5InsertCtx *pCtx = (Fts5InsertCtx*)pContext;
  Fts5Index *pIdx = pCtx->pStorage->pIndex;
  UNUSED_PARAM2(iUnused1, iUnused2);
  if( nToken>FTS5_MAX_TOKEN_SIZE ) nToken = FTS5_MAX_TOKEN_SIZE;
  if( (tflags & FTS5_TOKEN_COLOCATED)==0 || pCtx->szCol==0 ){
    pCtx->szCol++;
  }
  return sqlite3Fts5IndexWrite(pIdx, pCtx->iCol, pCtx->szCol-1, pToken, nToken);
}